

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O3

return_type_conflict1 * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__25&>
          (return_type_conflict1 *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  undefined1 *puVar1;
  _Uninitialized<double,_true> _Var2;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar4;
  return_type_conflict1 *prVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_class_1_0_00000001 local_39;
  _Variadic_union<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  byte local_18;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    pvVar4 = std::get<0ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    if (*pvVar4 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
      *(double *)
       &(__return_storage_ptr__->
        super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ).
        super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._value.
        super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> = (double)*pvVar4 / 3.0;
      prVar5 = (return_type_conflict1 *)0x0;
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ).
                       super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._value.
                       super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
                       super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
                       super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> + 0x10);
      *(undefined1 **)
       &(__return_storage_ptr__->
        super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ).
        super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._value.
        super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> = puVar1;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> + 0x10) =
           0x73706f6f;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> + 8) = 4;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> + 0x14) = 0;
      prVar5 = (return_type_conflict1 *)CONCAT71((int7)((ulong)puVar1 >> 8),1);
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_> + 0x20) =
         (__index_type)prVar5;
  }
  else {
    pvVar3 = std::get<1ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._M_first._M_storage = (_Uninitialized<double,_true>)((long)&local_38 + 0x10);
    _Var2._M_storage = (double)(pvVar3->_M_dataplus)._M_p;
    paVar6 = &pvVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_storage == paVar6) {
      local_38._16_8_ = paVar6->_M_allocated_capacity;
      local_38._24_8_ = *(undefined8 *)((long)&pvVar3->field_2 + 8);
    }
    else {
      local_38._16_8_ = paVar6->_M_allocated_capacity;
      local_38._M_first._M_storage = (_Uninitialized<double,_true>)_Var2._M_storage;
    }
    local_38._8_8_ = pvVar3->_M_string_length;
    (pvVar3->_M_dataplus)._M_p = (pointer)paVar6;
    pvVar3->_M_string_length = 0;
    (pvVar3->field_2)._M_local_buf[0] = '\0';
    local_18 = 1;
    std::__detail::__variant::
    _Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    prVar5 = (return_type_conflict1 *)
             (*std::__detail::__variant::
               __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
               ::_S_vtable._M_arr[local_18]._M_data)
                       (&local_39,
                        (variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_38);
  }
  return prVar5;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }